

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenemanager.cpp
# Opt level: O0

SceneManager * SceneManager::getInstance(void)

{
  SceneManager *this;
  
  if (instance == (SceneManager *)0x0) {
    this = (SceneManager *)operator_new(0x38);
    memset(this,0,0x38);
    SceneManager(this);
    instance = this;
  }
  return instance;
}

Assistant:

SceneManager * SceneManager::getInstance()
{
	if (instance == NULL) {
		instance = new SceneManager();
	}

	return instance;
}